

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
RPCResults::ToDescriptionString_abi_cxx11_(string *__return_storage_ptr__,RPCResults *this)

{
  long lVar1;
  pointer pRVar2;
  pointer this_00;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  Sections sections;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pRVar2 = (this->m_results).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_results).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                 .super__Vector_impl_data._M_start; this_00 != pRVar2; this_00 = this_00 + 1) {
    if (this_00->m_type != ANY) {
      if ((this_00->m_cond)._M_string_length == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"\nResult:\n");
      }
      else {
        std::operator+(&bStack_78,"\nResult (",&this_00->m_cond);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sections,&bStack_78,"):\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sections);
        std::__cxx11::string::~string((string *)&sections);
        std::__cxx11::string::~string((string *)&bStack_78);
      }
      sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sections.m_max_pad = 0;
      sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      RPCResult::ToSections(this_00,&sections,NONE,0);
      Sections::ToString_abi_cxx11_(&bStack_78,&sections);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&bStack_78);
      std::__cxx11::string::~string((string *)&bStack_78);
      std::vector<Section,_std::allocator<Section>_>::~vector
                ((vector<Section,_std::allocator<Section>_> *)&sections);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCResults::ToDescriptionString() const
{
    std::string result;
    for (const auto& r : m_results) {
        if (r.m_type == RPCResult::Type::ANY) continue; // for testing only
        if (r.m_cond.empty()) {
            result += "\nResult:\n";
        } else {
            result += "\nResult (" + r.m_cond + "):\n";
        }
        Sections sections;
        r.ToSections(sections);
        result += sections.ToString();
    }
    return result;
}